

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radefs_p.h
# Opt level: O2

int __thiscall asmjit::RAConstraints::init(RAConstraints *this,EVP_PKEY_CTX *ctx)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  iVar4 = (int)ctx;
  if (iVar4 - 1U < 2) {
    uVar1 = 0xff;
    uVar2 = 0xffff;
    if (iVar4 == 1) {
      uVar2 = 0xff;
    }
    uVar3 = uVar2 & 0xffffffef;
  }
  else {
    if (iVar4 != 6) {
      return 4;
    }
    uVar1 = 0;
    uVar2 = 0xffffffff;
    uVar3 = 0x7ffbffff;
  }
  this->_availableRegs[0] = uVar3;
  this->_availableRegs[1] = uVar2;
  this->_availableRegs[2] = uVar1;
  this->_availableRegs[3] = uVar1;
  return 0;
}

Assistant:

ASMJIT_NOINLINE Error init(uint32_t arch) noexcept {
    switch (arch) {
      case Environment::kArchX86:
      case Environment::kArchX64: {
        uint32_t registerCount = arch == Environment::kArchX86 ? 8 : 16;
        _availableRegs[BaseReg::kGroupGp] = Support::lsbMask<uint32_t>(registerCount) & ~Support::bitMask(4u);
        _availableRegs[BaseReg::kGroupVec] = Support::lsbMask<uint32_t>(registerCount);
        _availableRegs[BaseReg::kGroupOther0] = Support::lsbMask<uint32_t>(8);
        _availableRegs[BaseReg::kGroupOther1] = Support::lsbMask<uint32_t>(8);
        return kErrorOk;
      }

      case Environment::kArchAArch64: {
        _availableRegs[BaseReg::kGroupGp] = 0xFFFFFFFFu & ~Support::bitMask(18, 31u);
        _availableRegs[BaseReg::kGroupVec] = 0xFFFFFFFFu;
        _availableRegs[BaseReg::kGroupOther0] = 0;
        _availableRegs[BaseReg::kGroupOther1] = 0;
        return kErrorOk;
      }

      default:
        return DebugUtils::errored(kErrorInvalidArch);
    }
  }